

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmq.c
# Opt level: O2

void nmq_start(NMQ *q)

{
  uint32_t uVar1;
  dlnode **ppdVar2;
  uint32_t *__s;
  segment *node;
  uint8_t uVar3;
  bool bVar4;
  
  if (q->inited != '\0') {
    return;
  }
  q->inited = '\x01';
  if (q->steady_on == '\0') {
    uVar1 = 0;
  }
  else {
    uVar1 = (uint32_t)
            (long)((double)q->MTU *
                  ((double)((uint)q->flush_interval * q->MAX_SND_BUF_NUM) / 1000.0));
  }
  q->BYTES_PER_FLUSH = uVar1;
  ppdVar2 = (dlnode **)nmq_malloc((ulong)q->MAX_SND_BUF_NUM << 3);
  q->snd_sn_to_node = ppdVar2;
  memset(ppdVar2,0,(ulong)q->MAX_SND_BUF_NUM << 3);
  ppdVar2 = (dlnode **)nmq_malloc((ulong)q->MAX_RCV_BUF_NUM << 3);
  q->rcv_sn_to_node = ppdVar2;
  memset(ppdVar2,0,(ulong)q->MAX_RCV_BUF_NUM << 3);
  __s = (uint32_t *)nmq_malloc((ulong)q->ackmaxnum << 3);
  q->acklist = __s;
  memset(__s,0,(ulong)q->ackmaxnum << 3);
  uVar1 = q->MSS;
  uVar3 = (q->pool).CAP;
  dlist_init(&(q->pool).seg_list);
  (q->pool).left = uVar3;
  (q->pool).CAP = uVar3;
  (q->pool).MTU = uVar1;
  while (bVar4 = uVar3 != '\0', uVar3 = uVar3 + 0xff, bVar4) {
    node = new_segment(uVar1);
    dlist_add_tail(&(q->pool).seg_list,&node->head);
  }
  return;
}

Assistant:

void nmq_start(NMQ *q) {
    if (!q->inited) {
        q->inited = 1;
        init_steady_state(q);
        allocate_mem(q);
    }
}